

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O2

S2Point * S2::S2PointFromExact(S2Point *__return_storage_ptr__,Vector3_xf *xf)

{
  int32 iVar1;
  int extraout_EAX;
  int iVar2;
  int b;
  int i;
  int iVar3;
  double dVar4;
  double dVar5;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  ExactFloat local_c8;
  ExactFloat local_b8;
  ExactFloat local_a8;
  double local_98;
  BIGNUM *local_90;
  BasicVector<Vector3,_ExactFloat,_3UL> local_88 [8];
  BigNum local_80;
  ExactFloat local_78;
  BasicVector<Vector3,_ExactFloat,_3UL> local_68 [8];
  BigNum local_60;
  ExactFloat local_58;
  S2Point x;
  
  b = (int)xf;
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_a8,b);
  dVar4 = ExactFloat::ToDouble(&local_a8);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_c8,b);
  dVar5 = ExactFloat::ToDouble(&local_c8);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b8,b);
  x.c_[2] = ExactFloat::ToDouble(&local_b8);
  x.c_[0] = dVar4;
  x.c_[1] = dVar5;
  ExactFloat::BigNum::~BigNum(&local_b8.bn_);
  ExactFloat::BigNum::~BigNum(&local_c8.bn_);
  ExactFloat::BigNum::~BigNum(&local_a8.bn_);
  dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&x);
  if (dVar4 <= 0.0) {
    iVar2 = -0xbebc201;
    for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_a8,b);
      iVar1 = local_a8.bn_exp_;
      ExactFloat::BigNum::~BigNum(&local_a8.bn_);
      if (iVar1 < 0x7ffffffd) {
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_a8,b);
        ExactFloat::exp(&local_a8,__x);
        if (iVar2 <= extraout_EAX) {
          iVar2 = extraout_EAX;
        }
        ExactFloat::BigNum::~BigNum(&local_a8.bn_);
      }
    }
    if (iVar2 < -200000000) {
      __return_storage_ptr__->c_[0] = 0.0;
      __return_storage_ptr__->c_[1] = 0.0;
      __return_storage_ptr__->c_[2] = 0.0;
    }
    else {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_b8,b);
      ldexp(__x_00,(int)&local_c8);
      dVar4 = ExactFloat::ToDouble(&local_c8);
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[](local_68,b);
      ldexp(__x_01,(int)&local_58);
      local_90 = (BIGNUM *)ExactFloat::ToDouble(&local_58);
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[](local_88,b);
      ldexp(__x_02,(int)&local_78);
      local_98 = ExactFloat::ToDouble(&local_78);
      local_a8.bn_.bn_ = local_90;
      local_a8._0_8_ = dVar4;
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_a8);
      ExactFloat::BigNum::~BigNum(&local_78.bn_);
      ExactFloat::BigNum::~BigNum(&local_80);
      ExactFloat::BigNum::~BigNum(&local_58.bn_);
      ExactFloat::BigNum::~BigNum(&local_60);
      ExactFloat::BigNum::~BigNum(&local_c8.bn_);
      ExactFloat::BigNum::~BigNum(&local_b8.bn_);
    }
  }
  else {
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
              (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&x);
  }
  return __return_storage_ptr__;
}

Assistant:

static S2Point S2PointFromExact(const Vector3_xf& xf) {
  // If all components of "x" have absolute value less than about 1e-154,
  // then x.Norm2() is zero in double precision due to underflow.  Therefore
  // we need to scale "x" by an appropriate power of 2 before the conversion.
  S2Point x(xf[0].ToDouble(), xf[1].ToDouble(), xf[2].ToDouble());
  if (x.Norm2() > 0) return x.Normalize();

  // Scale so that the largest component magnitude is in the range [0.5, 1).
  int exp = ExactFloat::kMinExp - 1;
  for (int i = 0; i < 3; ++i) {
    if (xf[i].is_normal()) exp = std::max(exp, xf[i].exp());
  }
  if (exp < ExactFloat::kMinExp) {
    return S2Point(0, 0, 0);
  }
  return S2Point(ldexp(xf[0], -exp).ToDouble(),
                 ldexp(xf[1], -exp).ToDouble(),
                 ldexp(xf[2], -exp).ToDouble()).Normalize();
}